

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O3

void __thiscall xray_re::xr_ogf_v3::setup_ib0(xr_ogf_v3 *this)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  ulong uVar6;
  ogf3_vsplit *poVar7;
  ulong uVar8;
  ogf3_vsplit *poVar9;
  ulong uVar10;
  ulong uVar11;
  
  xr_ibuf::operator=(&this->m_ib0,&(this->super_xr_ogf).m_ib);
  uVar6 = (ulong)this->m_min_vertices;
  poVar7 = this->m_vsplits;
  uVar3 = (this->super_xr_ogf).m_vb.super_xr_flexbuf.m_size;
  poVar9 = poVar7 + (uVar3 - uVar6);
  if (poVar7 != poVar9) {
    puVar4 = this->m_fix_faces;
    puVar5 = (this->m_ib0).m_indices;
    uVar10 = 0;
    do {
      bVar2 = poVar7->fix_faces;
      uVar1 = uVar10 + bVar2;
      uVar11 = uVar10;
      if (uVar10 < uVar1) {
        uVar8 = 0;
        do {
          puVar5[puVar4[uVar10 + uVar8]] = (uint16_t)uVar6;
          uVar8 = uVar8 + 1;
          uVar11 = uVar1;
        } while (bVar2 != uVar8);
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      poVar7 = poVar7 + 1;
      uVar10 = uVar11;
    } while (poVar7 != poVar9);
  }
  if (uVar3 != (uVar6 & 0xffff)) {
    __assert_fail("active_vb_size == m_vb.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,99,"void xray_re::xr_ogf_v3::setup_ib0()");
  }
  return;
}

Assistant:

void xr_ogf_v3::setup_ib0()
{
	m_ib0 = m_ib;
	size_t fix_idx = 0;
	uint16_t active_vb_size = uint16_t(m_min_vertices & UINT16_MAX);
	for (ogf3_vsplit *p = m_vsplits, *end = p + m_vb.size() - m_min_vertices; p != end; ++p) {
		for (uint_fast32_t end_idx = fix_idx + p->fix_faces; fix_idx < end_idx; ++fix_idx)
			m_ib0[m_fix_faces[fix_idx]] = active_vb_size;
		++active_vb_size;
	}
	assert(active_vb_size == m_vb.size());
}